

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogLikelihoodsMulti
          (BeagleCPUImpl<float,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *scalingFactorsIndices,int count,double *outSumLogLikelihood)

{
  float *pfVar1;
  float fVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  float *pfVar9;
  float **ppfVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  float *pfVar15;
  float *pfVar16;
  int j;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  float *pfVar23;
  ulong uVar24;
  int k;
  long lVar25;
  long lVar26;
  float fVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar33 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_ZMM3 [64];
  undefined8 in_XMM6_Qb;
  allocator_type local_121;
  float *local_120;
  ulong local_118;
  float *local_110;
  BeagleCPUImpl<float,_1,_0> *local_108;
  long local_100;
  ulong local_f8;
  int local_ec;
  uint local_e8;
  uint local_e4;
  float *local_e0;
  float *local_d8;
  int *local_d0;
  int *local_c8;
  int *local_c0;
  int *local_b8;
  int *local_b0;
  ulong local_a8;
  ulong local_a0;
  float *local_98;
  float *local_90;
  ulong local_88;
  ulong local_80;
  long local_78;
  long local_70;
  long local_68;
  vector<float,_std::allocator<float>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  
  local_d0 = parentBufferIndices;
  local_c8 = childBufferIndices;
  local_c0 = probabilityIndices;
  local_b8 = categoryWeightsIndices;
  local_b0 = stateFrequenciesIndices;
  std::vector<int,_std::allocator<int>_>::vector
            (&indexMaxScale,(long)this->kPatternCount,(allocator_type *)&maxScaleFactor);
  std::vector<float,_std::allocator<float>_>::vector
            (&maxScaleFactor,(long)this->kPatternCount,&local_121);
  local_100 = (long)count;
  local_a0 = (ulong)(count - 1);
  local_a8 = (ulong)(uint)(~(count >> 0x1f) & count);
  local_108 = this;
  for (uVar20 = 0; uVar20 != local_a8; uVar20 = uVar20 + 1) {
    local_d8 = this->gPartials[local_d0[uVar20]];
    local_120 = this->gTransitionMatrices[local_c0[uVar20]];
    local_e0 = this->gCategoryWeights[local_b8[uVar20]];
    local_110 = this->gStateFrequencies[local_b0[uVar20]];
    iVar19 = local_c8[uVar20];
    local_118 = uVar20;
    memset(this->integrationTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 4);
    if ((iVar19 < this->kTipCount) && (piVar8 = this->gTipStates[iVar19], piVar8 != (int *)0x0)) {
      uVar4 = this->kPatternCount;
      lVar22 = 0;
      local_f8 = (ulong)(uint)(~(this->kCategoryCount >> 0x1f) & this->kCategoryCount);
      for (uVar20 = 0; uVar20 != local_f8; uVar20 = uVar20 + 1) {
        uVar5 = this->kStateCount;
        iVar19 = this->kPartialsPaddedStateCount;
        iVar6 = this->kMatrixSize;
        lVar22 = (long)(int)lVar22;
        lVar25 = 0;
        fVar27 = local_e0[uVar20];
        pfVar16 = local_d8 + lVar22;
        for (uVar24 = 0; uVar24 != (~((int)uVar4 >> 0x1f) & uVar4); uVar24 = uVar24 + 1) {
          lVar25 = (long)(int)lVar25;
          iVar7 = local_108->kTransPaddedStateCount;
          pfVar9 = local_108->integrationTmp;
          pfVar15 = local_120 + (long)(iVar6 * (int)uVar20) + (long)piVar8[uVar24];
          for (uVar17 = 0; (~((int)uVar5 >> 0x1f) & uVar5) != uVar17; uVar17 = uVar17 + 1) {
            fVar2 = *pfVar15;
            pfVar15 = pfVar15 + iVar7;
            auVar29 = vfmadd213ss_fma(ZEXT416((uint)(fVar2 * pfVar16[uVar17])),ZEXT416((uint)fVar27)
                                      ,ZEXT416((uint)pfVar9[lVar25 + uVar17]));
            in_ZMM1 = ZEXT1664(auVar29);
            pfVar9[lVar25 + uVar17] = auVar29._0_4_;
          }
          lVar22 = lVar22 + iVar19;
          lVar25 = lVar25 + uVar17;
          pfVar16 = pfVar16 + iVar19;
        }
        this = local_108;
      }
    }
    else {
      uVar4 = this->kStateCount;
      local_90 = this->gPartials[iVar19];
      local_98 = local_90 + 2;
      lVar22 = 0;
      local_f8 = CONCAT44(local_f8._4_4_,uVar4 + 1);
      local_e8 = ~(this->kPatternCount >> 0x1f) & this->kPatternCount;
      local_88 = (ulong)(uint)(~(this->kCategoryCount >> 0x1f) & this->kCategoryCount);
      uVar20 = 0;
      while (uVar24 = uVar20, uVar24 != local_88) {
        local_70 = (long)this->kPartialsPaddedStateCount;
        auVar29._0_8_ = (double)local_e0[uVar24];
        auVar29._8_8_ = in_ZMM1._8_8_;
        lVar25 = (long)(int)lVar22;
        lVar26 = 0;
        local_78 = local_70 * 4;
        local_ec = this->kMatrixSize * (int)uVar24;
        pfVar16 = local_98 + lVar25;
        pfVar15 = local_90 + lVar25;
        uVar5 = 0;
        while (uVar18 = uVar5, lVar22 = lVar25, uVar18 != local_e8) {
          lVar26 = (long)(int)lVar26;
          uVar20 = 0;
          pfVar9 = local_108->integrationTmp;
          iVar19 = local_ec;
          while (uVar20 != (~((int)uVar4 >> 0x1f) & uVar4)) {
            auVar30 = ZEXT816(0) << 0x40;
            lVar25 = 0;
            pfVar23 = pfVar15;
            while (lVar25 < (int)uVar4 / 4 << 2) {
              lVar12 = iVar19 + lVar25;
              lVar13 = lVar25 + -2;
              lVar14 = lVar25 + 2;
              pfVar1 = pfVar16 + lVar25;
              lVar25 = lVar25 + 4;
              pfVar23 = pfVar23 + 4;
              auVar33._0_4_ =
                   (float)*(undefined8 *)(local_120 + lVar12) *
                   (float)*(undefined8 *)(pfVar16 + lVar13);
              auVar33._4_4_ =
                   (float)((ulong)*(undefined8 *)(local_120 + lVar12) >> 0x20) *
                   (float)((ulong)*(undefined8 *)(pfVar16 + lVar13) >> 0x20);
              auVar33._8_8_ = 0;
              auVar34._0_4_ =
                   (float)*(undefined8 *)(local_120 + iVar19 + lVar14) *
                   (float)*(undefined8 *)pfVar1;
              auVar34._4_4_ =
                   (float)((ulong)*(undefined8 *)(local_120 + iVar19 + lVar14) >> 0x20) *
                   (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
              auVar34._8_8_ = 0;
              auVar33 = vcvtps2pd_avx(auVar33);
              dVar28 = auVar30._8_8_;
              auVar34 = vcvtps2pd_avx(auVar34);
              auVar30._0_8_ = auVar30._0_8_ + auVar33._0_8_ + auVar34._0_8_;
              auVar30._8_8_ = dVar28 + auVar33._8_8_ + auVar34._8_8_;
            }
            in_ZMM2 = ZEXT1664(auVar30);
            for (; lVar25 < (int)uVar4; lVar25 = lVar25 + 1) {
              fVar27 = *pfVar23;
              pfVar23 = pfVar23 + 1;
              in_ZMM2 = ZEXT864((ulong)(in_ZMM2._0_8_ +
                                       (double)(local_120[iVar19 + lVar25] * fVar27)));
            }
            lVar25 = lVar22 + uVar20;
            auVar35._0_8_ = (double)pfVar9[lVar26];
            auVar35._8_8_ = in_XMM6_Qb;
            auVar30 = vshufpd_avx(auVar30,auVar30,1);
            iVar19 = iVar19 + uVar4 + 1;
            uVar20 = uVar20 + 1;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = (auVar30._0_8_ + in_ZMM2._0_8_) * (double)local_d8[lVar25];
            auVar30 = vfmadd231sd_fma(auVar35,auVar29,auVar31);
            in_ZMM3 = ZEXT1664(auVar30);
            in_ZMM1 = ZEXT1664(CONCAT124(auVar30._4_12_,(float)auVar30._0_8_));
            pfVar9[lVar26] = (float)auVar30._0_8_;
            lVar26 = lVar26 + 1;
          }
          pfVar16 = pfVar16 + local_70;
          pfVar15 = pfVar15 + local_70;
          lVar25 = lVar22 + local_70;
          local_e4 = uVar18;
          local_68 = lVar22;
          uVar5 = uVar18 + 1;
        }
        this = local_108;
        local_80 = uVar24;
        uVar20 = uVar24 + 1;
      }
    }
    lVar25 = 0;
    pfVar16 = local_110;
    uVar20 = local_118;
    lVar22 = local_100;
    for (lVar26 = 0; lVar26 < this->kPatternCount; lVar26 = lVar26 + 1) {
      auVar29 = ZEXT816(0) << 0x40;
      uVar17 = (ulong)(uint)(~(this->kStateCount >> 0x1f) & this->kStateCount);
      for (uVar24 = 0; in_ZMM2 = ZEXT1664(auVar29), uVar17 != uVar24; uVar24 = uVar24 + 1) {
        auVar29 = vfmadd231ss_fma(auVar29,ZEXT416((uint)pfVar16[uVar24]),
                                  ZEXT416((uint)this->integrationTmp[(long)(int)lVar25 + uVar24]));
      }
      if (*scalingFactorsIndices != -1) {
        ppfVar10 = this->gScaleBuffers;
        pfVar15 = ppfVar10[scalingFactorsIndices[uVar20]];
        if (uVar20 == 0) {
          indexMaxScale.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar26] = 0;
          uVar21 = 0;
          fVar27 = pfVar15[lVar26];
          maxScaleFactor.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar26] = fVar27;
          for (uVar24 = 1; uVar20 = local_118, (long)uVar24 < lVar22; uVar24 = uVar24 + 1) {
            fVar2 = ppfVar10[scalingFactorsIndices[uVar24]][lVar26];
            in_ZMM1 = ZEXT464((uint)fVar2);
            if (fVar27 < fVar2) {
              indexMaxScale.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar26] = (int)uVar24;
              maxScaleFactor.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[lVar26] = fVar2;
              uVar21 = uVar24 & 0xffffffff;
              fVar27 = fVar2;
            }
          }
        }
        else {
          uVar21 = (ulong)(uint)indexMaxScale.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar26];
        }
        pfVar16 = local_110;
        if (uVar20 != uVar21) {
          local_120 = (float *)CONCAT44(local_120._4_4_,auVar29._0_4_);
          dVar28 = exp((double)(pfVar15[lVar26] -
                               maxScaleFactor.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar26]));
          in_ZMM1 = ZEXT1664(CONCAT88(in_ZMM3._8_8_,(double)local_120._0_4_));
          dVar28 = dVar28 * (double)local_120._0_4_;
          in_ZMM2 = ZEXT864(CONCAT44((int)((ulong)dVar28 >> 0x20),(float)dVar28));
          pfVar16 = local_110;
          uVar20 = local_118;
          lVar22 = local_100;
        }
      }
      pfVar15 = this->outLogLikelihoodsTmp;
      if (uVar20 == 0) {
        pfVar15[lVar26] = in_ZMM2._0_4_;
      }
      else {
        fVar27 = in_ZMM2._0_4_ + pfVar15[lVar26];
        if (uVar20 == local_a0) {
          dVar28 = log((double)fVar27);
          pfVar15 = this->outLogLikelihoodsTmp;
          fVar27 = (float)dVar28;
          pfVar16 = local_110;
          uVar20 = local_118;
          lVar22 = local_100;
        }
        pfVar15[lVar26] = fVar27;
      }
      lVar25 = (long)(int)lVar25 + uVar17;
    }
  }
  uVar4 = this->kPatternCount;
  if (*scalingFactorsIndices == -1) {
    uVar20 = (ulong)(~((int)uVar4 >> 0x1f) & uVar4);
  }
  else {
    pfVar16 = this->outLogLikelihoodsTmp;
    uVar20 = (ulong)(~((int)uVar4 >> 0x1f) & uVar4);
    for (uVar24 = 0; uVar20 != uVar24; uVar24 = uVar24 + 1) {
      pfVar16[uVar24] =
           maxScaleFactor.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[uVar24] + pfVar16[uVar24];
    }
  }
  auVar29 = ZEXT816(0) << 0x40;
  *outSumLogLikelihood = 0.0;
  pdVar11 = this->gPatternWeights;
  pfVar16 = this->outLogLikelihoodsTmp;
  for (uVar24 = 0; uVar20 != uVar24; uVar24 = uVar24 + 1) {
    auVar32._0_8_ = (double)pfVar16[uVar24];
    auVar32._8_8_ = in_ZMM2._8_8_;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = pdVar11[uVar24];
    auVar29 = vfmadd231sd_fma(auVar29,auVar32,auVar3);
    *outSumLogLikelihood = auVar29._0_8_;
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&maxScaleFactor.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&indexMaxScale.super__Vector_base<int,_std::allocator<int>_>);
  return (uint)!NAN(auVar29._0_8_) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsMulti(const int* parentBufferIndices,
                                                                   const int* childBufferIndices,
                                                                   const int* probabilityIndices,
                                                                   const int* categoryWeightsIndices,
                                                                   const int* stateFrequenciesIndices,
                                                                   const int* scalingFactorsIndices,
                                                                   int count,
                                                                   double* outSumLogLikelihood) {

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    int returnCode = BEAGLE_SUCCESS;

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const REALTYPE* partialsParent = gPartials[parentBufferIndices[subsetIndex]];
        const REALTYPE* transMatrix = gTransitionMatrices[probabilityIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        int childIndex = childBufferIndices[subsetIndex];

        memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = 0; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = 0; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = 0; k < kPatternCount; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
            }
        } else {
            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = 0;
            int stateCountModFour = (kStateCount / 4) * 4;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = 0;
                const REALTYPE weight = wt[l];
                for(int k = 0; k < kPatternCount; k++) {
                    int w = l * kMatrixSize;
                    const REALTYPE* partialsChildPtr = &partialsChild[v];
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJA = 0.0, sumOverJB = 0.0;
                        int j = 0;
                        const REALTYPE* transMatrixPtr = &transMatrix[w];
                        for (; j < stateCountModFour; j += 4) {
                            sumOverJA += transMatrixPtr[j + 0] * partialsChildPtr[j + 0];
                            sumOverJB += transMatrixPtr[j + 1] * partialsChildPtr[j + 1];
                            sumOverJA += transMatrixPtr[j + 2] * partialsChildPtr[j + 2];
                            sumOverJB += transMatrixPtr[j + 3] * partialsChildPtr[j + 3];

                        }
                        for (; j < kStateCount; j++) {
                            sumOverJA += transMatrixPtr[j] * partialsChildPtr[j];
                        }
//                        for(int j = 0; j < kStateCount; j++) {
//                            sumOverJ += transMatrix[w] * partialsChild[v + j];
//                            w++;
//                        }
                        integrationTmp[u] += (sumOverJA + sumOverJB) * partialsParent[v + i] * weight;
                        u++;

                        w += kStateCount;

                        // increment for the extra column at the end
                        w += T_PAD;
                    }
                    v += kPartialsPaddedStateCount;
                }
            }

        }
        int u = 0;
        for(int k = 0; k < kPatternCount; k++) {
            REALTYPE sumOverI = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                u++;
            }

            if (scalingFactorsIndices[0] != BEAGLE_OP_NONE) {
                int cumulativeScalingFactorIndex;
                cumulativeScalingFactorIndex = scalingFactorsIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        tmpScaleFactor = gScaleBuffers[scalingFactorsIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sumOverI *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }



            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sumOverI;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sumOverI;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sumOverI;
            }

        }

    }

    if (scalingFactorsIndices[0] != BEAGLE_OP_NONE) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }


    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}